

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O2

pint p_test_case_sha3_256_test(void)

{
  p_test_module_fail_counter = 0;
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA3_256,0x20,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",&DAT_001043d0,
                    &DAT_001043f0,&DAT_00104410,
                    "3a985da74fe225b2045c172d6bd390bd855f086e3e9d525b46bfe24511431532",
                    "41c0dba2a9d6240849100376a8235e2c82e1b9998a999e21db32dd97496d3376",
                    "5c8875ae474a3634ba4fd55ec85bffd661f32aca75c6d699d0cdcb6c115891c1",
                    "e37ed9f31da3d61740e04c3124a2da5dbe8be0a2ef5c8b5932d45eb1958219e2");
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (sha3_256_test)
{
	const puchar	hash_etalon_1[] = { 58, 152,  93, 167,  79, 226,  37, 178,
					     4,  92,  23,  45, 107, 211, 144, 189,
					   133,  95,   8, 110,  62, 157,  82,  91,
					    70, 191, 226,  69,  17,  67,  21,  50};
	const puchar	hash_etalon_2[] = { 65, 192, 219, 162, 169, 214,  36,   8,
					    73,  16,   3, 118, 168,  35,  94,  44,
					   130, 225, 185, 153, 138, 153, 158,  33,
					   219,  50, 221, 151,  73, 109,  51, 118};
	const puchar	hash_etalon_3[] = { 92, 136, 117, 174,  71,  74,  54,  52,
					   186,  79, 213,  94, 200,  91, 255, 214,
					    97, 243,  42, 202, 117, 198, 214, 153,
					   208, 205, 203, 108,  17,  88, 145, 193};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA3_256,
			   32,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "3a985da74fe225b2045c172d6bd390bd855f086e3e9d525b46bfe24511431532",
			   "41c0dba2a9d6240849100376a8235e2c82e1b9998a999e21db32dd97496d3376",
			   "5c8875ae474a3634ba4fd55ec85bffd661f32aca75c6d699d0cdcb6c115891c1",
			   "e37ed9f31da3d61740e04c3124a2da5dbe8be0a2ef5c8b5932d45eb1958219e2");

	p_libsys_shutdown ();
}